

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

StructBuilder *
capnp::_::WireHelpers::initStructPointer
          (StructBuilder *__return_storage_ptr__,WirePointer *ref,SegmentBuilder *segment,
          CapTableBuilder *capTable,StructSize size,BuilderArena *orphanArena)

{
  WordCountN<17> amount;
  word *data;
  word *ptr;
  BuilderArena *orphanArena_local;
  CapTableBuilder *capTable_local;
  SegmentBuilder *segment_local;
  WirePointer *ref_local;
  StructSize size_local;
  
  capTable_local = (CapTableBuilder *)segment;
  segment_local = (SegmentBuilder *)ref;
  ref_local._4_4_ = size;
  amount = StructSize::total((StructSize *)((long)&ref_local + 4));
  data = allocate((WirePointer **)&segment_local,(SegmentBuilder **)&capTable_local,capTable,amount,
                  STRUCT,orphanArena);
  WirePointer::StructRef::set
            ((StructRef *)((long)&(segment_local->super_SegmentReader).arena + 4),ref_local._4_4_);
  StructBuilder::StructBuilder
            (__return_storage_ptr__,(SegmentBuilder *)capTable_local,capTable,data,
             (WirePointer *)(data + (int)((uint)ref_local._4_4_ & 0xffff)),
             ((uint)ref_local._4_4_ & 0xffff) << 6,ref_local._6_2_);
  return __return_storage_ptr__;
}

Assistant:

static KJ_ALWAYS_INLINE(StructBuilder initStructPointer(
      WirePointer* ref, SegmentBuilder* segment, CapTableBuilder* capTable, StructSize size,
      BuilderArena* orphanArena = nullptr)) {
    // Allocate space for the new struct.  Newly-allocated space is automatically zeroed.
    word* ptr = allocate(ref, segment, capTable, size.total(), WirePointer::STRUCT, orphanArena);

    // Initialize the pointer.
    ref->structRef.set(size);

    // Build the StructBuilder.
    return StructBuilder(segment, capTable, ptr, reinterpret_cast<WirePointer*>(ptr + size.data),
                         size.data * BITS_PER_WORD, size.pointers);
  }